

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * phosg::parse_data_string
                   (string *__return_storage_ptr__,string *s,string *mask,uint64_t flags)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  uint64_t mask_00;
  bool bVar6;
  size_type sVar7;
  char *pcVar8;
  ulonglong uVar9;
  float local_c4;
  double dStack_c0;
  uint32_t value_6;
  uint64_t value_5;
  uint16_t value_4;
  ulonglong uStack_b0;
  uint32_t value_3;
  uint64_t value_2;
  size_type local_88;
  size_t pre_size;
  int16_t value_1;
  int16_t value;
  undefined4 local_70;
  byte local_69;
  undefined1 local_68 [7];
  bool read_nybble;
  string filename;
  bool mask_enabled;
  bool big_endian;
  bool reading_filename;
  bool reading_high_nybble;
  bool reading_multiline_comment;
  bool reading_comment;
  bool reading_unicode_string;
  bool reading_string;
  uint8_t chr;
  bool host_big_endian;
  char *in;
  uint64_t uStack_28;
  bool allow_files;
  uint64_t flags_local;
  string *mask_local;
  string *s_local;
  string *data;
  
  in._7_1_ = (flags & 1) != 0;
  uStack_28 = flags;
  flags_local = (uint64_t)mask;
  mask_local = s;
  s_local = __return_storage_ptr__;
  _reading_high_nybble =
       ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str(s);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (flags_local != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)flags_local);
  }
  mask_enabled = false;
  bVar3 = false;
  bVar4 = false;
  bVar1 = false;
  bVar2 = false;
  bVar6 = true;
  filename.field_2._M_local_buf[0xf] = '\0';
  filename.field_2._M_local_buf[0xe] = '\0';
  filename.field_2._M_local_buf[0xd] = '\x01';
  ::std::__cxx11::string::string((string *)local_68);
  while (*_reading_high_nybble != '\0') {
    local_69 = 0;
    if (bVar1) {
      if (*_reading_high_nybble == '\n') {
        bVar1 = false;
      }
      _reading_high_nybble = _reading_high_nybble + 1;
    }
    else if (bVar2) {
      if ((*_reading_high_nybble == '*') && (_reading_high_nybble[1] == '/')) {
        bVar2 = false;
        _reading_high_nybble = _reading_high_nybble + 2;
      }
      else {
        _reading_high_nybble = _reading_high_nybble + 1;
      }
    }
    else if (bVar3) {
      if (*_reading_high_nybble == '\"') {
        bVar3 = false;
        _reading_high_nybble = _reading_high_nybble + 1;
      }
      else if (*_reading_high_nybble == '\\') {
        if (_reading_high_nybble[1] == '\0') break;
        if (_reading_high_nybble[1] == 'n') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,'\n');
        }
        else if (_reading_high_nybble[1] == 'r') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,'\r');
        }
        else if (_reading_high_nybble[1] == 't') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,'\t');
        }
        else if (_reading_high_nybble[1] == '\"') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,'\"');
        }
        else if (_reading_high_nybble[1] == '\'') {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,'\'');
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,_reading_high_nybble[1]);
        }
        add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),1);
        _reading_high_nybble = _reading_high_nybble + 2;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,*_reading_high_nybble);
        add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),1);
        _reading_high_nybble = _reading_high_nybble + 1;
      }
    }
    else if (bVar4) {
      if (*_reading_high_nybble == '\'') {
        bVar4 = false;
        _reading_high_nybble = _reading_high_nybble + 1;
      }
      else if (*_reading_high_nybble == '\\') {
        if (_reading_high_nybble[1] == '\0') break;
        if (_reading_high_nybble[1] == 'n') {
          pre_size._2_2_ = 10;
        }
        else if (_reading_high_nybble[1] == 'r') {
          pre_size._2_2_ = 0xd;
        }
        else if (_reading_high_nybble[1] == 't') {
          pre_size._2_2_ = 9;
        }
        else {
          pre_size._2_2_ = (uint16_t)_reading_high_nybble[1];
        }
        if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
          pre_size._2_2_ = bswap16(pre_size._2_2_);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(char *)((long)&pre_size + 2),2);
        add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),2);
        _reading_high_nybble = _reading_high_nybble + 2;
      }
      else {
        pre_size._0_2_ = (uint16_t)*_reading_high_nybble;
        if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
          pre_size._0_2_ = bswap16((uint16_t)pre_size);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,(char *)&pre_size,2);
        add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),2);
        _reading_high_nybble = _reading_high_nybble + 1;
      }
    }
    else if ((filename.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (*_reading_high_nybble == '?') {
        filename.field_2._M_local_buf[0xd] = (filename.field_2._M_local_buf[0xd] ^ 0xffU) & 1;
        _reading_high_nybble = _reading_high_nybble + 1;
      }
      else if (*_reading_high_nybble == '$') {
        filename.field_2._M_local_buf[0xe] = (filename.field_2._M_local_buf[0xe] ^ 0xffU) & 1;
        _reading_high_nybble = _reading_high_nybble + 1;
      }
      else if (*_reading_high_nybble == '#') {
        pcVar8 = _reading_high_nybble + 1;
        if (*pcVar8 == '#') {
          pcVar8 = _reading_high_nybble + 2;
          if (*pcVar8 == '#') {
            pcVar8 = _reading_high_nybble + 3;
            if (*pcVar8 == '#') {
              _reading_high_nybble = _reading_high_nybble + 4;
              uStack_b0 = strtoull(_reading_high_nybble,(char **)&reading_high_nybble,0);
              if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
                uStack_b0 = bswap64(uStack_b0);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&stack0xffffffffffffff50,8);
              add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),8);
            }
            else {
              _reading_high_nybble = pcVar8;
              uVar9 = strtoull(pcVar8,(char **)&reading_high_nybble,0);
              value_5._4_4_ = (uint32_t)uVar9;
              if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
                value_5._4_4_ = bswap32(value_5._4_4_);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)((long)&value_5 + 4),4);
              add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),4);
            }
          }
          else {
            _reading_high_nybble = pcVar8;
            uVar9 = strtoull(pcVar8,(char **)&reading_high_nybble,0);
            value_5._2_2_ = (uint16_t)uVar9;
            if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
              value_5._2_2_ = bswap16(value_5._2_2_);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,(char *)((long)&value_5 + 2),2);
            add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),2);
          }
        }
        else {
          _reading_high_nybble = pcVar8;
          uVar9 = strtoull(pcVar8,(char **)&reading_high_nybble,0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,1,(char)uVar9);
          add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),1);
        }
      }
      else if (*_reading_high_nybble == '%') {
        pcVar8 = _reading_high_nybble + 1;
        if (*pcVar8 == '%') {
          _reading_high_nybble = _reading_high_nybble + 2;
          dStack_c0 = strtod(_reading_high_nybble,(char **)&reading_high_nybble);
          if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
            dStack_c0 = (double)bswap64((uint64_t)dStack_c0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&stack0xffffffffffffff40,8);
          add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),8);
        }
        else {
          _reading_high_nybble = pcVar8;
          local_c4 = strtof(pcVar8,(char **)&reading_high_nybble);
          if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
            local_c4 = (float)bswap32((uint32_t)local_c4);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&local_c4,4);
          add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),4);
        }
      }
      else {
        if ((*_reading_high_nybble < '0') || ('9' < *_reading_high_nybble)) {
          if ((*_reading_high_nybble < 'A') || ('F' < *_reading_high_nybble)) {
            if ((*_reading_high_nybble < 'a') || ('f' < *_reading_high_nybble)) {
              if (*_reading_high_nybble == '\"') {
                bVar3 = true;
              }
              else if (*_reading_high_nybble == '\'') {
                bVar4 = true;
              }
              else if ((*_reading_high_nybble == '/') && (_reading_high_nybble[1] == '/')) {
                bVar1 = true;
              }
              else if ((*_reading_high_nybble == '/') && (_reading_high_nybble[1] == '*')) {
                bVar2 = true;
              }
              else if ((*_reading_high_nybble == '<') && ((in._7_1_ & 1) != 0)) {
                filename.field_2._M_local_buf[0xf] = '\x01';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                clear((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68)
                ;
              }
            }
            else {
              local_69 = 1;
              mask_enabled = (bool)(mask_enabled | *_reading_high_nybble + 0xa9U);
            }
          }
          else {
            local_69 = 1;
            mask_enabled = (bool)(mask_enabled | *_reading_high_nybble - 0x37U);
          }
        }
        else {
          local_69 = 1;
          mask_enabled = (bool)(mask_enabled | *_reading_high_nybble - 0x30U);
        }
        _reading_high_nybble = _reading_high_nybble + 1;
      }
    }
    else {
      if (*_reading_high_nybble == '>') {
        filename.field_2._M_local_buf[0xf] = '\0';
        local_88 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::size(__return_storage_ptr__);
        load_file((string *)&value_2,(string *)local_68);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_2);
        ::std::__cxx11::string::~string((string *)&value_2);
        mask_00 = flags_local;
        uVar5 = filename.field_2._M_local_buf[0xd];
        sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(__return_storage_ptr__);
        add_mask_bits((string *)mask_00,(bool)(uVar5 & 1),sVar7 - local_88);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,1,
                   *_reading_high_nybble);
      }
      _reading_high_nybble = _reading_high_nybble + 1;
    }
    if ((local_69 & 1) != 0) {
      if (bVar6) {
        mask_enabled = (bool)(mask_enabled << 4);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,mask_enabled);
        add_mask_bits((string *)flags_local,(bool)(filename.field_2._M_local_buf[0xd] & 1),1);
        mask_enabled = false;
      }
      bVar6 = (bool)(bVar6 ^ 1);
    }
  }
  local_70 = 1;
  ::std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

string parse_data_string(const string& s, string* mask, uint64_t flags) {
  bool allow_files = flags & ParseDataFlags::ALLOW_FILES;

  const char* in = s.c_str();

  string data;
  if (mask) {
    mask->clear();
  }

#ifdef PHOSG_BIG_ENDIAN
  constexpr bool host_big_endian = true;
#else
  constexpr bool host_big_endian = false;
#endif

  uint8_t chr = 0;
  bool reading_string = false;
  bool reading_unicode_string = false;
  bool reading_comment = false;
  bool reading_multiline_comment = false;
  bool reading_high_nybble = true;
  bool reading_filename = false;
  bool big_endian = false;
  bool mask_enabled = true;
  string filename;
  while (in[0]) {
    bool read_nybble = 0;

    // if between // and a newline, don't write to output buffer
    if (reading_comment) {
      if (in[0] == '\n') {
        reading_comment = false;
      }
      in++;

      // if between /* and */, don't write to output buffer
    } else if (reading_multiline_comment) {
      if ((in[0] == '*') && (in[1] == '/')) {
        reading_multiline_comment = 0;
        in += 2;
      } else {
        in++;
      }

      // if between quotes, read bytes to output buffer, unescaping where needed
    } else if (reading_string) {
      if (in[0] == '\"') {
        reading_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          data += '\n';
        } else if (in[1] == 'r') {
          data += '\r';
        } else if (in[1] == 't') {
          data += '\t';
        } else if (in[1] == '\"') {
          data += '\"';
        } else if (in[1] == '\'') {
          data += '\'';
        } else {
          data += in[1];
        }
        add_mask_bits(mask, mask_enabled, 1);
        in += 2;

      } else {
        data += in[0];
        add_mask_bits(mask, mask_enabled, 1);
        in++;
      }

      // if between single quotes, word-expand bytes to output buffer, unescaping
    } else if (reading_unicode_string) {
      if (in[0] == '\'') {
        reading_unicode_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        int16_t value;
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          value = '\n';
        } else if (in[1] == 'r') {
          value = '\r';
        } else if (in[1] == 't') {
          value = '\t';
        } else {
          value = in[1];
        }
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in += 2;

      } else {
        int16_t value = in[0];
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in++;
      }

      // if between <>, read a file name, then stick that file into the buffer
    } else if (reading_filename) {
      if (in[0] == '>') {
        // TODO: support <filename@offset:size> syntax
        reading_filename = 0;
        size_t pre_size = data.size();
        data += load_file(filename);
        add_mask_bits(mask, mask_enabled, data.size() - pre_size);

      } else {
        filename.append(1, in[0]);
      }
      in++;

      // ? inverts mask_enabled
    } else if (in[0] == '?') {
      mask_enabled = !mask_enabled;
      in++;

      // $ changes the endianness
    } else if (in[0] == '$') {
      big_endian = !big_endian;
      in++;

      // # signifies a decimal number
    } else if (in[0] == '#') { // 8-bit
      in++;
      if (in[0] == '#') { // 16-bit
        in++;
        if (in[0] == '#') { // 32-bit
          in++;
          if (in[0] == '#') { // 64-bit
            in++;
            uint64_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap64(value);
            }
            data.append((const char*)&value, 8);
            add_mask_bits(mask, mask_enabled, 8);

          } else {
            uint32_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap32(value);
            }
            data.append((const char*)&value, 4);
            add_mask_bits(mask, mask_enabled, 4);
          }

        } else {
          uint16_t value = strtoull(in, const_cast<char**>(&in), 0);
          if (big_endian != host_big_endian) {
            value = bswap16(value);
          }
          data.append((const char*)&value, 2);
          add_mask_bits(mask, mask_enabled, 2);
        }

      } else {
        data.append(1, (char)strtoull(in, const_cast<char**>(&in), 0));
        add_mask_bits(mask, mask_enabled, 1);
      }

      // % is a float, %% is a double
    } else if (in[0] == '%') {
      in++;
      if (in[0] == '%') {
        in++;

        uint64_t value;
        *(double*)&value = strtod(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap64(value);
        }
        data.append((const char*)&value, 8);
        add_mask_bits(mask, mask_enabled, 8);

      } else {
        uint32_t value;
        *(float*)&value = strtof(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap32(value);
        }
        data.append((const char*)&value, 4);
        add_mask_bits(mask, mask_enabled, 4);
      }

      // anything else is a hex digit
    } else {
      if ((in[0] >= '0') && (in[0] <= '9')) {
        read_nybble = true;
        chr |= (in[0] - '0');

      } else if ((in[0] >= 'A') && (in[0] <= 'F')) {
        read_nybble = true;
        chr |= (in[0] - 'A' + 0x0A);

      } else if ((in[0] >= 'a') && (in[0] <= 'f')) {
        read_nybble = true;
        chr |= (in[0] - 'a' + 0x0A);

      } else if (in[0] == '\"') {
        reading_string = true;

      } else if (in[0] == '\'') {
        reading_unicode_string = 1;

      } else if ((in[0] == '/') && (in[1] == '/')) {
        reading_comment = 1;

      } else if ((in[0] == '/') && (in[1] == '*')) {
        reading_multiline_comment = 1;

      } else if (in[0] == '<' && allow_files) {
        reading_filename = 1;
        filename.clear();
      }
      in++;
    }

    if (read_nybble) {
      if (reading_high_nybble) {
        chr = chr << 4;
      } else {
        data += (char)chr;
        add_mask_bits(mask, mask_enabled, 1);
        chr = 0;
      }
      reading_high_nybble = !reading_high_nybble;
    }
  }
  return data;
}